

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O1

bool scale_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *S,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *F,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping,int64_t M,size_t sigma,
                size_t freq_sum)

{
  uint uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  int iVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM3_Qb;
  
  if (sigma != 0) {
    sVar5 = 0;
    do {
      uVar1 = (mapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar5];
      auVar3._8_8_ = in_XMM3_Qb;
      auVar3._0_8_ = in_XMM3_Qa;
      auVar3 = vcvtusi2sd_avx512f(auVar3,freq_sum);
      auVar8._0_8_ = (double)M / auVar3._0_8_;
      auVar8._8_8_ = in_XMM3_Qb;
      uVar2 = (F->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar1];
      auVar4._8_8_ = in_XMM3_Qb;
      auVar4._0_8_ = in_XMM3_Qa;
      auVar3 = vcvtusi2sd_avx512f(auVar4,uVar2);
      auVar3 = vfmadd213sd_fma(auVar3,auVar8,ZEXT816(0x3fe0000000000000));
      iVar6 = vcvttsd2usi_avx512f(auVar3);
      uVar7 = iVar6 + (uint)(iVar6 == 0);
      (S->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar1] = uVar7;
      M = M - (ulong)uVar7;
      if (M < 0) {
        return true;
      }
      freq_sum = freq_sum - uVar2;
      sVar5 = sVar5 + 1;
    } while (sigma != sVar5);
  }
  return M != 0;
}

Assistant:

bool scale_freqs(std::vector<uint32_t>& S, const std::vector<uint64_t>& F,
    std::vector<uint32_t>& mapping, int64_t M, size_t sigma, size_t freq_sum)
{
    double fratio = double(M) / double(freq_sum);
    for (size_t cur_sym = 0; cur_sym < sigma; cur_sym++) {
        auto mapped_sym = mapping[cur_sym];
        double aratio = double(M) / double(freq_sum);
        double ratio
            = (sigma - cur_sym) * fratio / sigma + cur_sym * aratio / sigma;
        S[mapped_sym] = (uint32_t)(0.5 + aratio * F[mapped_sym]);
        if (S[mapped_sym] == 0)
            S[mapped_sym] = 1;
        M -= S[mapped_sym];
        freq_sum -= F[mapped_sym];
        if (M < 0)
            break;
    }
    return M != 0;
}